

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O0

void __thiscall mau::ProxySession::workerLoop(ProxySession *this)

{
  bool bVar1;
  atomic<bool> *in_RDI;
  io_context *unaff_retaddr;
  
  SetCurrentThreadName((char *)0x120f8f);
  while( true ) {
    bVar1 = std::atomic::operator_cast_to_bool(in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x120fb6);
    asio::io_context::run(unaff_retaddr);
  }
  return;
}

Assistant:

void ProxySession::workerLoop()
{
    SetCurrentThreadName("ProxySession:Worker");

    while (!Terminated) {
        Context->run();
    }
}